

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NtkSortCubes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *vCubes_00;
  Vec_Str_t *vStore_00;
  Abc_Obj_t *pObj;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Vec_Str_t *vStore;
  Vec_Ptr_t *vCubes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                  ,0x148,"void Abc_NtkSortCubes(Abc_Ntk_t *)");
  }
  vCubes_00 = Vec_PtrAlloc(1000);
  vStore_00 = Vec_StrAlloc(1000);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj = Abc_NtkObj(pNtk,local_2c);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      Abc_NodeSortCubes(pObj,vCubes_00,vStore_00);
    }
  }
  Vec_StrFree(vStore_00);
  Vec_PtrFree(vCubes_00);
  return;
}

Assistant:

void Abc_NtkSortCubes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vCubes;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkHasSop(pNtk) );
    vCubes = Vec_PtrAlloc( 1000 );
    vStore = Vec_StrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Abc_NodeSortCubes( pNode, vCubes, vStore );
    Vec_StrFree( vStore );
    Vec_PtrFree( vCubes );
}